

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O0

vecIdxTy * __thiscall
Apt::ShortestPath(Apt *this,size_t _startN,size_t _endN,double _maxLen,double _headingAtStart,
                 double _headingAtEnd)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  reference puVar4;
  iterator list;
  reference pvVar5;
  value_type_conflict2 *pvVar6;
  value_type_conflict2 *pvVar7;
  LTError *this_00;
  reference pvVar8;
  value_type_conflict2 *in_RCX;
  value_type_conflict2 *in_RDX;
  long in_RSI;
  int __x;
  vecIdxTy *in_RDI;
  reference pvVar9;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar10;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  size_t nIdx;
  double lenToUpd;
  double eAngle;
  TaxiNode *updN;
  size_t updNIdx;
  TaxiEdge *e;
  size_t eIdx;
  iterator __end2;
  iterator __begin2;
  vecIdxTy *__range2;
  double angleToShortestN;
  size_t idxEdgeToShortestN;
  TaxiNode *shortestN;
  size_t shortestNIdx;
  iterator i;
  double shortestDist;
  iterator shortestIter;
  TaxiNode *endN;
  TaxiNode *startN;
  vecIdxTy vecVisit;
  TaxiNode *n;
  iterator __end1;
  iterator __begin1;
  vecTaxiNodesTy *__range1;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe28;
  vector<TaxiNode,_std::allocator<TaxiNode>_> *in_stack_fffffffffffffe30;
  value_type_conflict2 *in_stack_fffffffffffffe38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe40;
  const_iterator in_stack_fffffffffffffe48;
  double in_stack_fffffffffffffe58;
  Apt *in_stack_fffffffffffffe60;
  Apt *in_stack_fffffffffffffe68;
  value_type_conflict2 *local_140;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_f8;
  vecIdxTy *local_f0;
  double __value;
  size_type __n;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a8;
  double local_a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_98;
  reference local_90;
  reference local_78;
  reference local_58;
  TaxiNode *local_50;
  __normal_iterator<TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_> local_48;
  long local_40;
  double local_38;
  double local_30;
  double local_28;
  value_type_conflict2 *local_20;
  
  if (in_RDX == in_RCX) {
    memset(in_RDI,0,0x18);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bbb68);
  }
  else {
    local_40 = in_RSI + 0xb8;
    local_38 = in_XMM2_Qa;
    local_30 = in_XMM1_Qa;
    local_28 = in_XMM0_Qa;
    local_20 = in_RCX;
    local_48._M_current =
         (TaxiNode *)
         std::vector<TaxiNode,_std::allocator<TaxiNode>_>::begin
                   ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)
                    in_stack_fffffffffffffe28._M_current);
    local_50 = (TaxiNode *)
               std::vector<TaxiNode,_std::allocator<TaxiNode>_>::end
                         ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)
                          in_stack_fffffffffffffe28._M_current);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                               *)in_stack_fffffffffffffe30,
                              (__normal_iterator<TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>
                               *)in_stack_fffffffffffffe28._M_current), bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>::
                 operator*(&local_48);
      TaxiNode::InitDijkstraAttr(local_58);
      __gnu_cxx::__normal_iterator<TaxiNode_*,_std::vector<TaxiNode,_std::allocator<TaxiNode>_>_>::
      operator++(&local_48);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bbc06);
    local_78 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at
                         (in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28._M_current)
    ;
    local_90 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at
                         (in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28._M_current)
    ;
    local_78->pathLen = 0.0;
    local_78->prevIdx = 0xfffffffffffffffe;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
LAB_001bbc9f:
    bVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      (in_stack_fffffffffffffe40);
    bVar1 = false;
    if (!bVar2) {
      bVar1 = local_90->prevIdx == 0xffffffffffffffff;
    }
    if (bVar1) {
      local_98._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_fffffffffffffe28._M_current);
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_98);
      pvVar8 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::operator[]
                         ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)(in_RSI + 0xb8),*puVar4);
      local_a0 = pvVar8->pathLen;
      local_a8 = std::
                 next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                           (in_stack_fffffffffffffe28,0x1bbd4f);
      while( true ) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffe28._M_current);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffe30,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffffe28._M_current);
        if (!bVar1) break;
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_a8);
        pvVar8 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::operator[]
                           ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)(in_RSI + 0xb8),*puVar4);
        if (pvVar8->pathLen < local_a0) {
          local_98._M_current = local_a8._M_current;
          puVar4 = __gnu_cxx::
                   __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::operator*(&local_a8);
          pvVar8 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::operator[]
                             ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)(in_RSI + 0xb8),*puVar4
                             );
          local_a0 = pvVar8->pathLen;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_a8);
      }
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_98);
      __n = *puVar4;
      pvVar8 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::operator[]
                         ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)(in_RSI + 0xb8),__n);
      if (pvVar8->prevIdx < 0xfffffffffffffffe) {
        in_stack_fffffffffffffe60 =
             (Apt *)GetEdgeBetweenNodes(in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60,
                                        (size_t)in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe68 = in_stack_fffffffffffffe60;
      }
      else {
        in_stack_fffffffffffffe68 = (Apt *)0xffffffffffffffff;
      }
      in_stack_fffffffffffffe58 = local_30;
      if (in_stack_fffffffffffffe68 != (Apt *)0xffffffffffffffff) {
        pvVar5 = std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::operator[]
                           ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)(in_RSI + 0xe8),
                            (size_type)in_stack_fffffffffffffe68);
        in_stack_fffffffffffffe58 = TaxiEdge::GetAngleFrom(pvVar5,pvVar8->prevIdx);
      }
      pvVar8->bVisited = true;
      __value = in_stack_fffffffffffffe58;
      __gnu_cxx::
      __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
      ::__normal_iterator<unsigned_long*>
                ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffe30,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffe28._M_current);
      list = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                       (in_stack_fffffffffffffe40,in_stack_fffffffffffffe48);
      local_f0 = &pvVar8->vecEdges;
      local_f8._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     (in_stack_fffffffffffffe28._M_current);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffe28._M_current);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffe30,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffe28._M_current), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_f8);
        pvVar5 = std::vector<TaxiEdge,_std::allocator<TaxiEdge>_>::operator[]
                           ((vector<TaxiEdge,_std::allocator<TaxiEdge>_> *)(in_RSI + 0xe8),*puVar4);
        bVar1 = TaxiEdge::isValid(pvVar5);
        if (bVar1) {
          pvVar6 = (value_type_conflict2 *)TaxiEdge::otherNode(pvVar5,__n);
          pvVar8 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::operator[]
                             ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)(in_RSI + 0xb8),
                              (size_type)pvVar6);
          if ((pvVar8->bVisited & 1U) == 0) {
            pvVar9 = pvVar5;
            TaxiEdge::GetAngleFrom(pvVar5,__n);
            __x = (int)pvVar9;
            uVar3 = std::isnan(__value);
            if ((uVar3 & 1) == 0) {
              in_stack_fffffffffffffe48._M_current =
                   (unsigned_long *)
                   HeadingDiff(in_stack_fffffffffffffe48._M_current,
                               (double)in_stack_fffffffffffffe40);
              std::abs(__x);
              if (100.0 < extraout_XMM0_Qa) goto LAB_001bc20e;
            }
            if ((pvVar6 == local_20) && (uVar3 = std::isnan(local_38), (uVar3 & 1) == 0)) {
              in_stack_fffffffffffffe40 =
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   HeadingDiff((double)in_stack_fffffffffffffe48._M_current,
                               (double)in_stack_fffffffffffffe40);
              std::abs(__x);
              if (100.0 < extraout_XMM0_Qa_00) goto LAB_001bc20e;
            }
            dVar10 = local_a0 + pvVar5->dist_m;
            if ((dVar10 <= local_28) && (dVar10 < pvVar8->pathLen)) {
              pvVar8->pathLen = dVar10;
              pvVar8->prevIdx = __n;
              if (pvVar6 == local_20) break;
              push_back_unique<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)list._M_current,
                         in_stack_fffffffffffffe48._M_current);
            }
          }
        }
LAB_001bc20e:
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_f8);
      }
      goto LAB_001bbc9f;
    }
    if (local_90->prevIdx == 0xffffffffffffffff) {
      memset(in_RDI,0,0x18);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bc255);
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1bc272);
      local_140 = local_20;
      while (local_140 < (value_type_conflict2 *)0xfffffffffffffffe) {
        pvVar6 = local_140;
        pvVar7 = (value_type_conflict2 *)
                 std::vector<TaxiNode,_std::allocator<TaxiNode>_>::size
                           ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)(in_RSI + 0xb8));
        if (pvVar7 <= pvVar6) {
          this_00 = (LTError *)__cxa_allocate_exception(0x18);
          LTError::LTError(this_00,
                           "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                           ,0x49e,"ShortestPath",logFATAL,"ASSERT FAILED: %s",
                           "nIdx < vecTaxiNodes.size()");
          __cxa_throw(this_00,&LTError::typeinfo,LTError::~LTError);
        }
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (in_stack_fffffffffffffe40,pvVar6);
        pvVar8 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::operator[]
                           ((vector<TaxiNode,_std::allocator<TaxiNode>_> *)(in_RSI + 0xb8),
                            (size_type)local_140);
        local_140 = (value_type_conflict2 *)pvVar8->prevIdx;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe30,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 in_stack_fffffffffffffe28._M_current);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffe40);
  }
  return in_RDI;
}

Assistant:

vecIdxTy ShortestPath (size_t _startN, size_t _endN, double _maxLen,
                           double _headingAtStart,
                           double _headingAtEnd)
    {
        // Sanity check: _start and _end should differ
        if (_startN == _endN)
            return vecIdxTy();


        // Initialize the Dijkstra values in the nodes array
        for (TaxiNode& n: vecTaxiNodes)
            n.InitDijkstraAttr();

        // This array stores nodes we need to visit
        // (have an initial distance, but aren't fully visited yet)
        vecIdxTy vecVisit;

        // The start place is the given taxiway node
        TaxiNode& startN = vecTaxiNodes.at(_startN);
        const TaxiNode& endN   = vecTaxiNodes.at(_endN);
        startN.pathLen = 0.0;
        startN.prevIdx = ULONG_MAX-1;   // we use "ULONG_MAX-1" for saying "is a start node"
        vecVisit.push_back(_startN);

        // General heading between start and end (reversed)
        // defines first heading (how we leave _startN) and
        // how far the plane is allowed to turn
        
        // outer loop controls currently visited node and checks if end already found
        while (!vecVisit.empty() && endN.prevIdx == ULONG_MAX)
        {
            // fetch node with shortest yet known distance
            // (this isn't awfully efficient, but keeping a separate map or prio-queue
            //  sorted while updating nodes in the next loop
            //  is not simple either. I expect vecVisit to stay short
            //  due to cut-off at _maxLen, so I've decided this way:)
            vecIdxTy::iterator shortestIter = vecVisit.begin();
            double shortestDist = vecTaxiNodes[*shortestIter].pathLen;
            for (vecIdxTy::iterator i = std::next(shortestIter);
                 i != vecVisit.end(); ++i)
            {
                if (vecTaxiNodes[*i].pathLen < shortestDist) {
                    shortestIter = i;
                    shortestDist = vecTaxiNodes[*i].pathLen;
                }
            }
            const size_t shortestNIdx  = *shortestIter;
            TaxiNode& shortestN = vecTaxiNodes[shortestNIdx];
            
            // To avoid too sharp corners we need to know the angle by which we reach this shortest node
            const size_t idxEdgeToShortestN =
            shortestN.prevIdx >= ULONG_MAX-1 ? EDGE_UNKNOWN :
            GetEdgeBetweenNodes(shortestN.prevIdx, shortestNIdx);
            // start heading for when leaving first node, otherwise heading between previous and current node
            const double angleToShortestN =
            idxEdgeToShortestN == EDGE_UNKNOWN ? _headingAtStart :
            vecTaxiEdges[idxEdgeToShortestN].GetAngleFrom(shortestN.prevIdx);
            
            // This one is now already counted as "visited" so no more updates to its pathLen!
            shortestN.bVisited = true;
            vecVisit.erase(shortestIter);

            // Update all connected nodes with best possible distance
            for (size_t eIdx: shortestN.vecEdges)
            {
                const TaxiEdge& e = vecTaxiEdges[eIdx];
                if (!e.isValid()) continue;
                
                size_t updNIdx    = e.otherNode(shortestNIdx);
                TaxiNode& updN    = vecTaxiNodes[updNIdx];
                
                // if aleady visited then no need to re-assess
                if (updN.bVisited)
                    continue;
                
                // Don't allow turns of more than 100°,
                // ie. edge not valid if it would turn more than that
                const double eAngle = e.GetAngleFrom(shortestNIdx);
                if (!std::isnan(angleToShortestN) &&
                    std::abs(HeadingDiff(angleToShortestN,
                                         eAngle)) > APT_MAX_PATH_TURN)
                    continue;
                
                // If the node being analyzed is the end node, then we also
                // need to verify if the heading from end node to actual a/c position
                // would not again cause too sharp a turn:
                if (updNIdx == _endN && !std::isnan(_headingAtEnd) &&
                    std::abs(HeadingDiff(_headingAtEnd, eAngle)) > APT_MAX_PATH_TURN)
                    continue;
                
                // Calculate the yet known best distance to this node
                const double lenToUpd = shortestDist + e.dist_m;
                if (lenToUpd > _maxLen ||               // too far out?
                    updN.pathLen <= lenToUpd)           // node has a faster path already
                    continue;

                // Update this node with new best values
                updN.pathLen = lenToUpd;        // best new known distance
                updN.prevIdx = shortestNIdx;     // predecessor to achieve that distance
                
                // Have we reached the wanted end node?
                if (updNIdx == _endN)
                    break;
                
                // this node is now ready to be visited
                push_back_unique(vecVisit, updNIdx);
            }
        }
        
        // Found nothing? -> return empty list
        if (endN.prevIdx == ULONG_MAX)
            return vecIdxTy();
        
        // put together the nodes from _start through _end in the right order
        vecVisit.clear();
        for (size_t nIdx = _endN;
             nIdx < ULONG_MAX-1;                    // until nIdx becomes invalid
             nIdx = vecTaxiNodes[nIdx].prevIdx)     // move on to _previous_ node on shortest path
        {
            LOG_ASSERT(nIdx < vecTaxiNodes.size());
            vecVisit.push_back(nIdx);
        }
        return vecVisit;
    }